

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O2

bool __thiscall libwebm::BCMVHeader::Write(BCMVHeader *this,PacketDataBuffer *buffer)

{
  bool bVar1;
  int iVar2;
  int i;
  long lVar3;
  uint8_t bcmv_buffer [6];
  
  if (buffer == (PacketDataBuffer *)0x0) {
    fwrite("Webm2Pes: nullptr for buffer in BCMV Write.\n",0x2c,1,_stderr);
    bVar1 = false;
  }
  else {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (buffer,this->bcmv + lVar3);
    }
    iVar2 = this->length + 10;
    bcmv_buffer[0] = (uint8_t)((uint)iVar2 >> 0x18);
    bcmv_buffer[1] = (uint8_t)((uint)iVar2 >> 0x10);
    bcmv_buffer[2] = (uint8_t)((uint)iVar2 >> 8);
    bcmv_buffer[3] = (uint8_t)iVar2;
    bcmv_buffer[4] = '\0';
    bcmv_buffer[5] = '\0';
    bVar1 = CopyAndEscapeStartCodes(bcmv_buffer,6,buffer);
  }
  return bVar1;
}

Assistant:

bool BCMVHeader::Write(PacketDataBuffer* buffer) const {
  if (buffer == nullptr) {
    std::fprintf(stderr, "Webm2Pes: nullptr for buffer in BCMV Write.\n");
    return false;
  }
  const int kBcmvSize = 4;
  for (int i = 0; i < kBcmvSize; ++i)
    buffer->push_back(bcmv[i]);

  // Note: The 4 byte length field must include the size of the BCMV header.
  const int kRemainingBytes = 6;
  const uint32_t bcmv_total_length = length + static_cast<uint32_t>(size());
  const uint8_t bcmv_buffer[kRemainingBytes] = {
      static_cast<std::uint8_t>((bcmv_total_length >> 24) & 0xff),
      static_cast<std::uint8_t>((bcmv_total_length >> 16) & 0xff),
      static_cast<std::uint8_t>((bcmv_total_length >> 8) & 0xff),
      static_cast<std::uint8_t>(bcmv_total_length & 0xff),
      0,
      0 /* 2 bytes 0 padding */};

  return CopyAndEscapeStartCodes(bcmv_buffer, kRemainingBytes, buffer);
}